

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,void *object,size_t size)

{
  ostream *poVar1;
  ostream *poVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  ReusableStringStream rss;
  ReusableStringStream local_38;
  
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
  local_38.m_index = sVar4;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar2 = (ostream *)
           (pSVar3->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar4].m_ptr;
  local_38.m_oss = poVar2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0x",2);
  lVar5 = *(long *)poVar2;
  poVar1 = poVar2 + *(long *)(lVar5 + -0x18);
  if (poVar2[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar5 = *(long *)poVar2;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(uint *)(poVar2 + *(long *)(lVar5 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
  lVar5 = (long)(int)object;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size ) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        ReusableStringStream rss;
        rss << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             rss << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return rss.str();
    }